

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGValidateDoc(xmlRelaxNGValidCtxtPtr ctxt,xmlDocPtr doc)

{
  xmlElementType xVar1;
  xmlRelaxNGGrammarPtr_conflict pxVar2;
  xmlDocPtr pxVar3;
  int iVar4;
  int iVar5;
  xmlRelaxNGValidStatePtr pxVar6;
  xmlNodePtr pxVar7;
  xmlRelaxNGStatesPtr pxVar8;
  xmlGenericErrorFunc *pp_Var9;
  xmlRelaxNGValidCtxtPtr pxVar10;
  xmlDocPtr pxVar11;
  long lVar12;
  xmlGenericErrorFunc p_Var13;
  bool bVar14;
  xmlValidCtxt local_a0;
  
  if (doc == (xmlDocPtr)0x0 || ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
    return -1;
  }
  ctxt->doc = doc;
  iVar4 = -1;
  if (ctxt->schema == (xmlRelaxNGPtr)0x0) goto LAB_0017a3de;
  ctxt->errNo = 0;
  pxVar2 = ctxt->schema->topgrammar;
  if (pxVar2 == (xmlRelaxNGGrammarPtr_conflict)0x0) {
    xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NOGRAMMAR,(xmlChar *)0x0,(xmlChar *)0x0,0);
    goto LAB_0017a3de;
  }
  pxVar6 = xmlRelaxNGNewValidState(ctxt,(xmlNodePtr)0x0);
  ctxt->state = pxVar6;
  iVar4 = xmlRelaxNGValidateDefinition(ctxt,pxVar2->start);
  if ((ctxt->state == (xmlRelaxNGValidStatePtr)0x0) || (pxVar6->seq == (xmlNodePtr)0x0)) {
    pxVar8 = ctxt->states;
    if (pxVar8 != (xmlRelaxNGStatesPtr)0x0) {
      iVar5 = -1;
      for (lVar12 = 0; lVar12 < pxVar8->nbState; lVar12 = lVar12 + 1) {
        pxVar6 = pxVar8->tabState[lVar12];
        pxVar7 = xmlRelaxNGSkipIgnored(ctxt,pxVar6->seq);
        if (pxVar7 == (xmlNodePtr)0x0) {
          iVar5 = 0;
        }
        xmlRelaxNGFreeValidState(ctxt,pxVar6);
        pxVar8 = ctxt->states;
      }
      if (iVar5 == -1) goto LAB_0017a2ee;
    }
  }
  else {
    pxVar7 = xmlRelaxNGSkipIgnored(ctxt,ctxt->state->seq);
    if (pxVar7 != (xmlNodePtr)0x0) {
LAB_0017a2ee:
      if (iVar4 != -1) {
        xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_EXTRADATA,(xmlChar *)0x0,(xmlChar *)0x0,0);
        iVar4 = -1;
      }
    }
  }
  if (ctxt->state != (xmlRelaxNGValidStatePtr)0x0) {
    xmlRelaxNGFreeValidState(ctxt,ctxt->state);
    ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
  }
  if (iVar4 == 0) {
    if (ctxt->idref == 1) goto LAB_0017a344;
  }
  else {
    xmlRelaxNGDumpValidError(ctxt);
    if (ctxt->idref != 1) goto LAB_0017a3de;
LAB_0017a344:
    local_a0.doc = (xmlDocPtr)0x0;
    local_a0.vstateTab = (xmlValidState *)0x0;
    local_a0.am = (xmlAutomataPtr)0x0;
    local_a0.vstate = (xmlValidState *)0x0;
    local_a0.vstateNr = 0;
    local_a0.vstateMax = 0;
    local_a0.nodeTab = (xmlNodePtr *)0x0;
    local_a0.flags = 0;
    local_a0._52_4_ = 0;
    local_a0.node = (xmlNodePtr)0x0;
    local_a0.nodeNr = 0;
    local_a0.nodeMax = 0;
    local_a0.state = (xmlAutomataStatePtr)0x0;
    local_a0.error = (xmlValidityErrorFunc)0x0;
    local_a0.warning = (xmlValidityWarningFunc)0x0;
    local_a0.valid = 1;
    local_a0._68_4_ = 0;
    if (ctxt->error == (xmlGenericErrorFunc)0x0) {
      pp_Var9 = __xmlGenericError();
      local_a0.error = *pp_Var9;
      pp_Var9 = __xmlGenericError();
      p_Var13 = *pp_Var9;
      pxVar10 = (xmlRelaxNGValidCtxtPtr)__xmlGenericErrorContext();
    }
    else {
      p_Var13 = ctxt->warning;
      pxVar10 = ctxt;
      local_a0.error = ctxt->error;
    }
    bVar14 = iVar4 != 0;
    local_a0.userData = pxVar10->userData;
    local_a0.warning = p_Var13;
    iVar5 = xmlValidateDocumentFinal(&local_a0,doc);
    if (iVar5 != 1) {
      iVar4 = -1;
    }
    if (iVar5 != 1 || bVar14) goto LAB_0017a3de;
  }
  iVar4 = -(uint)(ctxt->errNo != 0);
LAB_0017a3de:
  xVar1 = doc->type;
  if ((xVar1 != XML_HTML_DOCUMENT_NODE) && (xVar1 != XML_DOCUMENT_NODE)) {
    if (xVar1 != XML_ELEMENT_NODE) {
LAB_0017a437:
      iVar5 = 1;
      if (iVar4 != -1) {
        iVar5 = iVar4;
      }
      return iVar5;
    }
    doc->version = (xmlChar *)0x0;
  }
  pxVar3 = (xmlDocPtr)doc->children;
LAB_0017a3f9:
  pxVar11 = pxVar3;
  if (pxVar11 != (xmlDocPtr)0x0) {
    if (pxVar11->type == XML_ELEMENT_NODE) goto code_r0x0017a407;
    goto LAB_0017a415;
  }
  goto LAB_0017a437;
code_r0x0017a407:
  pxVar11->version = (xmlChar *)0x0;
  pxVar3 = (xmlDocPtr)pxVar11->children;
  if ((xmlDocPtr)pxVar11->children == (xmlDocPtr)0x0) {
LAB_0017a415:
    do {
      pxVar3 = (xmlDocPtr)pxVar11->next;
      if ((xmlDocPtr)pxVar11->next != (xmlDocPtr)0x0) break;
      pxVar11 = (xmlDocPtr)pxVar11->parent;
      if (pxVar11 == (xmlDocPtr)0x0) {
        pxVar3 = (xmlDocPtr)0x0;
        break;
      }
      pxVar3 = (xmlDocPtr)0x0;
    } while (pxVar11 != doc);
  }
  goto LAB_0017a3f9;
}

Assistant:

int
xmlRelaxNGValidateDoc(xmlRelaxNGValidCtxtPtr ctxt, xmlDocPtr doc)
{
    int ret;

    if ((ctxt == NULL) || (doc == NULL))
        return (-1);

    ctxt->doc = doc;

    ret = xmlRelaxNGValidateDocument(ctxt, doc);
    /*
     * Remove all left PSVI
     */
    xmlRelaxNGCleanPSVI((xmlNodePtr) doc);

    /*
     * TODO: build error codes
     */
    if (ret == -1)
        return (1);
    return (ret);
}